

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O3

bool __thiscall draco::PointCloudEncoder::EncodePointAttributes(PointCloudEncoder *this)

{
  EncoderBuffer *pEVar1;
  AttributesEncoder *pAVar2;
  uint *puVar3;
  int *piVar4;
  __uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> _Var5;
  bool bVar6;
  char cVar7;
  int iVar8;
  unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_> *att_enc;
  pointer puVar9;
  uint *puVar10;
  int *piVar11;
  pointer puVar12;
  undefined1 local_19;
  
  iVar8 = (*this->_vptr_PointCloudEncoder[8])();
  if ((char)iVar8 != '\0') {
    pEVar1 = this->buffer_;
    puVar9 = (this->attributes_encoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar12 = (this->attributes_encoders_).
              super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_19 = (undefined1)((uint)((int)puVar12 - (int)puVar9) >> 3);
    if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)pEVar1,
                 (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_19,&stack0xffffffffffffffe8);
      puVar9 = (this->attributes_encoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar12 = (this->attributes_encoders_).
                super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; puVar9 != puVar12; puVar9 = puVar9 + 1) {
      pAVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
               .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl;
      iVar8 = (*pAVar2->_vptr_AttributesEncoder[2])(pAVar2,this,this->point_cloud_);
      if ((char)iVar8 == '\0') {
        return false;
      }
    }
    bVar6 = RearrangeAttributesEncoders(this);
    if (bVar6) {
      puVar10 = (uint *)(this->attributes_encoder_ids_order_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      puVar3 = (uint *)(this->attributes_encoder_ids_order_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish;
      if (puVar10 != puVar3) {
        do {
          iVar8 = (*this->_vptr_PointCloudEncoder[10])(this,(ulong)*puVar10);
          if ((char)iVar8 == '\0') {
            return false;
          }
          puVar10 = puVar10 + 1;
        } while (puVar10 != puVar3);
        piVar4 = (this->attributes_encoder_ids_order_).super__Vector_base<int,_std::allocator<int>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (piVar11 = (this->attributes_encoder_ids_order_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start; piVar11 != piVar4; piVar11 = piVar11 + 1) {
          _Var5._M_t.
          super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
          .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl =
               (this->attributes_encoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*piVar11]._M_t.
               super___uniq_ptr_impl<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
               ._M_t;
          cVar7 = (**(code **)(*(long *)_Var5._M_t.
                                        super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                                        .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>.
                                        _M_head_impl + 0x18))
                            (_Var5._M_t.
                             super__Tuple_impl<0UL,_draco::AttributesEncoder_*,_std::default_delete<draco::AttributesEncoder>_>
                             .super__Head_base<0UL,_draco::AttributesEncoder_*,_false>._M_head_impl,
                             this->buffer_);
          if (cVar7 == '\0') {
            return false;
          }
        }
      }
      iVar8 = (*this->_vptr_PointCloudEncoder[0xb])(this);
      return (bool)(char)iVar8;
    }
  }
  return false;
}

Assistant:

bool PointCloudEncoder::EncodePointAttributes() {
  if (!GenerateAttributesEncoders()) {
    return false;
  }

  // Encode the number of attribute encoders.
  buffer_->Encode(static_cast<uint8_t>(attributes_encoders_.size()));

  // Initialize all the encoders (this is used for example to init attribute
  // dependencies, no data is encoded in this step).
  for (auto &att_enc : attributes_encoders_) {
    if (!att_enc->Init(this, point_cloud_)) {
      return false;
    }
  }

  // Rearrange attributes to respect dependencies between individual attributes.
  if (!RearrangeAttributesEncoders()) {
    return false;
  }

  // Encode any data that is necessary to create the corresponding attribute
  // decoder.
  for (int att_encoder_id : attributes_encoder_ids_order_) {
    if (!EncodeAttributesEncoderIdentifier(att_encoder_id)) {
      return false;
    }
  }

  // Also encode any attribute encoder data (such as the info about encoded
  // attributes).
  for (int att_encoder_id : attributes_encoder_ids_order_) {
    if (!attributes_encoders_[att_encoder_id]->EncodeAttributesEncoderData(
            buffer_)) {
      return false;
    }
  }

  // Lastly encode all the attributes using the provided attribute encoders.
  if (!EncodeAllAttributes()) {
    return false;
  }
  return true;
}